

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  once_flag *__once;
  string *psVar4;
  long lVar5;
  Rep *pRVar6;
  bool bVar7;
  uint32 uVar8;
  uint32 uVar9;
  int iVar10;
  ulong uVar11;
  LogMessage *pLVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long *plVar15;
  Arena *arena;
  Reflection *this_00;
  InlinedStringField *string2;
  RepeatedPtrFieldBase *pRVar16;
  ArenaStringPtr *this_01;
  ulong uVar17;
  Arena *arena_00;
  ReflectionSchema *this_02;
  Message *__tmp;
  InlinedStringField *string1;
  RepeatedPtrFieldBase *pRVar18;
  string *this_03;
  string temp;
  FieldDescriptor *local_80;
  ulong local_78;
  FieldDescriptor *local_70;
  undefined1 local_68 [56];
  
  __once = *(once_flag **)(field + 0x30);
  if (*(int *)(field + 0x3c) == 3) {
    if (__once != (once_flag *)0x0) {
      local_68._0_8_ = FieldDescriptor::TypeOnceInit;
      local_80 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_80);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 8:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<int>::Swap
                ((RepeatedField<int> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<int> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 2:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<long>::Swap
                ((RepeatedField<long> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<long> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 3:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_int>::Swap
                ((RepeatedField<unsigned_int> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<unsigned_int> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 4:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_long>::Swap
                ((RepeatedField<unsigned_long> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<unsigned_long> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 5:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<double>::Swap
                ((RepeatedField<double> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<double> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 6:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<float>::Swap
                ((RepeatedField<float> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<float> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 7:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<bool>::Swap
                ((RepeatedField<bool> *)
                 ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
                 (RepeatedField<bool> *)
                 ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
      return;
    case 9:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar16 = (RepeatedPtrFieldBase *)
                ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar18 = (RepeatedPtrFieldBase *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      if (*(long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) !=
          *(long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)) {
        internal::RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  (pRVar16,pRVar18);
        return;
      }
      pRVar6 = pRVar16->rep_;
      pRVar16->rep_ = pRVar18->rep_;
      pRVar18->rep_ = pRVar6;
      iVar10 = pRVar16->current_size_;
      pRVar16->current_size_ = pRVar18->current_size_;
      pRVar18->current_size_ = iVar10;
      iVar10 = pRVar16->total_size_;
      pRVar16->total_size_ = pRVar18->total_size_;
      pRVar18->total_size_ = iVar10;
      return;
    case 10:
      bVar7 = anon_unknown_0::IsMapFieldInApi(field);
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar18 = (RepeatedPtrFieldBase *)
                ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      pRVar16 = (RepeatedPtrFieldBase *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
      if (bVar7) {
        (*(pRVar18->arena_->impl_).options_.block_alloc)((size_t)pRVar18);
        return;
      }
      if (pRVar16->arena_ != pRVar18->arena_) {
        internal::RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                  (pRVar18,pRVar16);
        return;
      }
      pRVar6 = pRVar18->rep_;
      pRVar18->rep_ = pRVar16->rep_;
      pRVar16->rep_ = pRVar6;
      iVar10 = pRVar18->current_size_;
      pRVar18->current_size_ = pRVar16->current_size_;
      pRVar16->current_size_ = iVar10;
      iVar10 = pRVar18->total_size_;
      pRVar18->total_size_ = pRVar16->total_size_;
      pRVar16->total_size_ = iVar10;
      return;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x193);
      pLVar12 = internal::LogMessage::operator<<((LogMessage *)local_68,"Unimplemented type: ");
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_80 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_70 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_80,
                   &local_70);
      }
      pLVar12 = internal::LogMessage::operator<<
                          (pLVar12,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                           (ulong)*(uint *)(field + 0x38) * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar12);
    }
LAB_0028d172:
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
    return;
  }
  if (__once != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_80 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_80);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
  case 3:
  case 8:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
         *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
    *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar3;
    break;
  case 2:
  case 4:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar1 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
         *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
    *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar1;
    break;
  case 5:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar1 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
         *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
    *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar1;
    break;
  case 6:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
         *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
    *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar3;
    break;
  case 7:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar2 = *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
         *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
    *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar2;
    break;
  case 9:
    uVar13 = (ulong)(uint)(this->schema_).metadata_offset_;
    arena = *(Arena **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar13);
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    arena_00 = *(Arena **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar13);
    if (((ulong)arena_00 & 1) != 0) {
      arena_00 = *(Arena **)(((ulong)arena_00 & 0xfffffffffffffffe) + 0x18);
    }
    this_02 = &this->schema_;
    bVar7 = internal::ReflectionSchema::IsFieldInlined(this_02,field);
    uVar8 = internal::ReflectionSchema::GetFieldOffset(this_02,field);
    this_03 = (string *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    uVar8 = internal::ReflectionSchema::GetFieldOffset(this_02,field);
    this_01 = (ArenaStringPtr *)
              ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    if (bVar7) {
      std::__cxx11::string::swap(this_03);
    }
    else {
      puVar14 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_02,field);
      if (arena == arena_00) {
        psVar4 = *(string **)this_03;
        *(string **)this_03 = this_01->ptr_;
        this_01->ptr_ = psVar4;
      }
      else {
        psVar4 = (string *)*puVar14;
        lVar5 = **(long **)this_03;
        local_68._0_8_ = local_68 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,lVar5,(*(long **)this_03)[1] + lVar5);
        internal::ArenaStringPtr::Set((ArenaStringPtr *)this_03,psVar4,this_01->ptr_,arena);
        internal::ArenaStringPtr::Set(this_01,psVar4,(string *)local_68,arena_00);
        if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
          operator_delete((void *)local_68._0_8_);
        }
      }
    }
    break;
  case 10:
    uVar11 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar13 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
    if ((uVar13 & 1) != 0) {
      uVar13 = *(ulong *)((uVar13 & 0xfffffffffffffffe) + 0x18);
    }
    local_78 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11);
    if ((local_78 & 1) != 0) {
      local_78 = *(ulong *)((local_78 & 0xfffffffffffffffe) + 0x18);
    }
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar11 = (ulong)uVar8;
    uVar17 = (ulong)uVar9;
    plVar15 = *(long **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
    if (uVar13 == local_78) {
      *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11) =
           *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17);
      *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17) = plVar15;
      return;
    }
    if (plVar15 == (long *)0x0) {
      if (*(long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17) == 0) {
        return;
      }
LAB_0028d39d:
      plVar15 = *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17);
      iVar10 = (*(message1->super_MessageLite)._vptr_MessageLite[5])(message1);
      plVar15 = (long *)(**(code **)(*plVar15 + 0x20))(plVar15,iVar10);
      *(long **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11) = plVar15;
      (**(code **)(*plVar15 + 0x80))
                (plVar15,*(undefined8 *)
                          ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17));
      message1 = message2;
    }
    else {
      if (*(long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17) != 0) {
        (**(code **)(*plVar15 + 0xa8))(plVar15);
        Swap(this_00,*(Message **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11),
             *(Message **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17));
        return;
      }
      if (plVar15 == (long *)0x0) goto LAB_0028d39d;
      iVar10 = (*(message2->super_MessageLite)._vptr_MessageLite[5])(message2);
      plVar15 = (long *)(**(code **)(*plVar15 + 0x20))(plVar15,iVar10);
      *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar17) = plVar15;
      (**(code **)(*plVar15 + 0x80))
                (plVar15,*(undefined8 *)
                          ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11));
    }
    ClearField(this,message1,field);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1e0);
    pLVar12 = internal::LogMessage::operator<<((LogMessage *)local_68,"Unimplemented type: ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_80 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_70 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_80,
                 &local_70);
    }
    pLVar12 = internal::LogMessage::operator<<
                        (pLVar12,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar12);
    goto LAB_0028d172;
  }
  return;
}

Assistant:

void Reflection::SwapField(Message* message1, Message* message2,
                           const FieldDescriptor* field) const {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                         \
    MutableRaw<RepeatedField<TYPE> >(message1, field)              \
        ->Swap(MutableRaw<RepeatedField<TYPE> >(message2, field)); \
    break;

      SWAP_ARRAYS(INT32, int32);
      SWAP_ARRAYS(INT64, int64);
      SWAP_ARRAYS(UINT32, uint32);
      SWAP_ARRAYS(UINT64, uint64);
      SWAP_ARRAYS(FLOAT, float);
      SWAP_ARRAYS(DOUBLE, double);
      SWAP_ARRAYS(BOOL, bool);
      SWAP_ARRAYS(ENUM, int);
#undef SWAP_ARRAYS

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrFieldBase>(message1, field)
                ->Swap<GenericTypeHandler<std::string> >(
                    MutableRaw<RepeatedPtrFieldBase>(message2, field));
            break;
        }
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message1, field)
              ->Swap(MutableRaw<MapFieldBase>(message2, field));
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message1, field)
              ->Swap<GenericTypeHandler<Message> >(
                  MutableRaw<RepeatedPtrFieldBase>(message2, field));
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  } else {
    switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    std::swap(*MutableRaw<TYPE>(message1, field),  \
              *MutableRaw<TYPE>(message2, field)); \
    break;

      SWAP_VALUES(INT32, int32);
      SWAP_VALUES(INT64, int64);
      SWAP_VALUES(UINT32, uint32);
      SWAP_VALUES(UINT64, uint64);
      SWAP_VALUES(FLOAT, float);
      SWAP_VALUES(DOUBLE, double);
      SWAP_VALUES(BOOL, bool);
      SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (GetArena(message1) == GetArena(message2)) {
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
        } else {
          Message** sub_msg1 = MutableRaw<Message*>(message1, field);
          Message** sub_msg2 = MutableRaw<Message*>(message2, field);
          if (*sub_msg1 == nullptr && *sub_msg2 == nullptr) break;
          if (*sub_msg1 && *sub_msg2) {
            (*sub_msg1)->GetReflection()->Swap(*sub_msg1, *sub_msg2);
            break;
          }
          if (*sub_msg1 == nullptr) {
            *sub_msg1 = (*sub_msg2)->New(message1->GetArena());
            (*sub_msg1)->CopyFrom(**sub_msg2);
            ClearField(message2, field);
          } else {
            *sub_msg2 = (*sub_msg1)->New(message2->GetArena());
            (*sub_msg2)->CopyFrom(**sub_msg1);
            ClearField(message1, field);
          }
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING: {
            Arena* arena1 = GetArena(message1);
            Arena* arena2 = GetArena(message2);

            if (IsInlined(field)) {
              InlinedStringField* string1 =
                  MutableRaw<InlinedStringField>(message1, field);
              InlinedStringField* string2 =
                  MutableRaw<InlinedStringField>(message2, field);
              string1->Swap(string2);
              break;
            }

            ArenaStringPtr* string1 =
                MutableRaw<ArenaStringPtr>(message1, field);
            ArenaStringPtr* string2 =
                MutableRaw<ArenaStringPtr>(message2, field);
            const std::string* default_ptr =
                &DefaultRaw<ArenaStringPtr>(field).Get();
            if (arena1 == arena2) {
              string1->Swap(string2, default_ptr, arena1);
            } else {
              const std::string temp = string1->Get();
              string1->Set(default_ptr, string2->Get(), arena1);
              string2->Set(default_ptr, temp, arena2);
            }
          } break;
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  }
}